

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_file_control(sqlite3 *db,char *zDbName,int op,void *pArg)

{
  uint nReserve;
  int iVar1;
  Pager *pPager;
  sqlite3_file *psVar2;
  int iVar3;
  Btree *p;
  Pager *pPVar4;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p = sqlite3DbNameToBtree(db,zDbName);
  if (p == (Btree *)0x0) {
    iVar3 = 1;
    goto LAB_0012c7f1;
  }
  sqlite3BtreeEnter(p);
  pPager = p->pBt->pPager;
  if (op == 0x2a) {
    iVar3 = 0;
    if (p->pBt->inTransaction == '\0') {
      sqlite3PagerClearCache(pPager);
    }
    goto LAB_0012c7e9;
  }
  pPVar4 = pPager;
  if (op == 0x1b) {
LAB_0012c7aa:
    *(sqlite3_vfs **)pArg = pPVar4->pVfs;
LAB_0012c7e7:
    iVar3 = 0;
  }
  else {
    if (op == 0x1c) {
      pPVar4 = (Pager *)&pPager->jfd;
      if (pPager->pWal != (Wal *)0x0) {
        pPVar4 = (Pager *)&pPager->pWal->pWalFd;
      }
      goto LAB_0012c7aa;
    }
    if (op == 0x23) {
      *(u32 *)pArg = pPager->iDataVersion;
      goto LAB_0012c7e7;
    }
    if (op == 0x26) {
      nReserve = *pArg;
      iVar3 = sqlite3BtreeGetRequestedReserve(p);
      *(int *)pArg = iVar3;
      iVar3 = 0;
      if (nReserve < 0x100) {
        iVar3 = 0;
        sqlite3BtreeSetPageSize(p,0,nReserve,0);
      }
    }
    else {
      psVar2 = pPager->fd;
      if (op == 7) {
        *(sqlite3_file **)pArg = psVar2;
        goto LAB_0012c7e7;
      }
      iVar1 = (db->busyHandler).nBusy;
      if (psVar2->pMethods == (sqlite3_io_methods *)0x0) {
        iVar3 = 0xc;
      }
      else {
        iVar3 = (*psVar2->pMethods->xFileControl)(psVar2,op,pArg);
      }
      (db->busyHandler).nBusy = iVar1;
    }
  }
LAB_0012c7e9:
  sqlite3BtreeLeave(p);
LAB_0012c7f1:
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_file_control(sqlite3 *db, const char *zDbName, int op, void *pArg){
  int rc = SQLITE_ERROR;
  Btree *pBtree;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  pBtree = sqlite3DbNameToBtree(db, zDbName);
  if( pBtree ){
    Pager *pPager;
    sqlite3_file *fd;
    sqlite3BtreeEnter(pBtree);
    pPager = sqlite3BtreePager(pBtree);
    assert( pPager!=0 );
    fd = sqlite3PagerFile(pPager);
    assert( fd!=0 );
    if( op==SQLITE_FCNTL_FILE_POINTER ){
      *(sqlite3_file**)pArg = fd;
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_VFS_POINTER ){
      *(sqlite3_vfs**)pArg = sqlite3PagerVfs(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_JOURNAL_POINTER ){
      *(sqlite3_file**)pArg = sqlite3PagerJrnlFile(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_DATA_VERSION ){
      *(unsigned int*)pArg = sqlite3PagerDataVersion(pPager);
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESERVE_BYTES ){
      int iNew = *(int*)pArg;
      *(int*)pArg = sqlite3BtreeGetRequestedReserve(pBtree);
      if( iNew>=0 && iNew<=255 ){
        sqlite3BtreeSetPageSize(pBtree, 0, iNew, 0);
      }
      rc = SQLITE_OK;
    }else if( op==SQLITE_FCNTL_RESET_CACHE ){
      sqlite3BtreeClearCache(pBtree);
      rc = SQLITE_OK;
    }else{
      int nSave = db->busyHandler.nBusy;
      rc = sqlite3OsFileControl(fd, op, pArg);
      db->busyHandler.nBusy = nSave;
    }
    sqlite3BtreeLeave(pBtree);
  }
  sqlite3_mutex_leave(db->mutex);
  return rc;
}